

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O1

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::
make_constraint<spvtools::opt::DependencePoint,spvtools::opt::SENode*,spvtools::opt::SENode*,spvtools::opt::Loop_const*>
          (LoopDependenceAnalysis *this,SENode **args,SENode **args_1,Loop **args_2)

{
  size_t *psVar1;
  SENode *pSVar2;
  SENode *pSVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  p_Var4 = (_List_node_base *)operator_new(0x20);
  pSVar2 = *args;
  pSVar3 = *args_1;
  p_Var4->_M_prev = (_List_node_base *)*args_2;
  p_Var4->_M_next = (_List_node_base *)&PTR_GetType_00b1f4f8;
  p_Var4[1]._M_next = (_List_node_base *)pSVar2;
  p_Var4[1]._M_prev = (_List_node_base *)pSVar3;
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = p_Var4;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->constraints_).
            super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (Constraint *)
         (this->constraints_).
         super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

Constraint* make_constraint(Args&&... args) {
    constraints_.push_back(
        std::unique_ptr<Constraint>(new T(std::forward<Args>(args)...)));

    return constraints_.back().get();
  }